

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

StatementMap * Js::FunctionBody::StatementMap::New(Recycler *recycler)

{
  Recycler *alloc;
  StatementMap *this;
  TrackAllocData local_38;
  Recycler *local_10;
  Recycler *recycler_local;
  
  local_10 = recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
             ,0x7bb);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_38);
  this = (StatementMap *)new<Memory::Recycler>(0x14,alloc,0x43c4b0);
  StatementMap(this);
  return this;
}

Assistant:

static StatementMap * New(Recycler* recycler)
                {
                    return RecyclerNew(recycler, StatementMap);
                }